

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall xemmai::t_emit::f_resolve(t_emit *this)

{
  deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> *this_00;
  bool bVar1;
  reference this_01;
  reference ppvVar2;
  reference puVar3;
  reference ppvVar4;
  unsigned_long i;
  const_iterator __end3;
  const_iterator __begin3;
  t_label *__range3;
  void *p;
  t_label *label;
  iterator __end2;
  iterator __begin2;
  deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> *__range2;
  t_emit *this_local;
  
  this_00 = this->v_labels;
  std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::begin
            ((iterator *)&__end2._M_node,this_00);
  std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::end
            ((iterator *)&label,this_00);
  while( true ) {
    bVar1 = std::operator==((_Self *)&__end2._M_node,(_Self *)&label);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_01 = std::
              _Deque_iterator<xemmai::t_emit::t_label,_xemmai::t_emit::t_label_&,_xemmai::t_emit::t_label_*>
              ::operator*((_Deque_iterator<xemmai::t_emit::t_label,_xemmai::t_emit::t_label_&,_xemmai::t_emit::t_label_*>
                           *)&__end2._M_node);
    ppvVar2 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (&this->v_code->v_instructions,this_01->v_target);
    __end3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (&this_01->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
    i = (unsigned_long)
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  (&this_01->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        (&__end3,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)&i);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end3);
      ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->v_code->v_instructions,*puVar3);
      *ppvVar4 = ppvVar2;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end3);
    }
    std::
    _Deque_iterator<xemmai::t_emit::t_label,_xemmai::t_emit::t_label_&,_xemmai::t_emit::t_label_*>::
    operator++((_Deque_iterator<xemmai::t_emit::t_label,_xemmai::t_emit::t_label_&,_xemmai::t_emit::t_label_*>
                *)&__end2._M_node);
  }
  return;
}

Assistant:

void f_resolve()
	{
		for (const auto& label : *v_labels) {
			void* p = &v_code->v_instructions[label.v_target];
			for (auto i : label) v_code->v_instructions[i] = p;
		}
	}